

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfd_psbt.cpp
# Opt level: O0

void __thiscall Psbt_SetOutputRecordTest_Test::TestBody(Psbt_SetOutputRecordTest_Test *this)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  bool bVar4;
  undefined1 uVar5;
  reference pvVar6;
  uchar *puVar7;
  uchar *puVar8;
  uint *puVar9;
  size_type sVar10;
  char *pcVar11;
  reference pvVar12;
  char *in_R9;
  AssertionResult gtest_ar_9;
  AssertionResult gtest_ar_8;
  AssertionResult gtest_ar_7;
  AssertionResult gtest_ar_6;
  vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> key_list;
  AssertionResult gtest_ar_5;
  AssertionResult gtest_ar_4;
  ByteData get_gval2;
  ByteData get_gval1;
  AssertionResult gtest_ar__2;
  AssertionResult gtest_ar__1;
  AssertionResult gtest_ar_;
  ByteData global_value2;
  ByteData global_key2;
  ByteData global_value1;
  ByteData global_key1;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  KeyData get_val2;
  KeyData get_val1;
  Psbt psbt2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  ByteData txout_value2;
  ByteData txout_key2;
  ByteData txout_value1;
  ByteData txout_key1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> plist2;
  vector<unsigned_int,_std::allocator<unsigned_int>_> plist1;
  vector<unsigned_char,_std::allocator<unsigned_char>_> fp2;
  vector<unsigned_char,_std::allocator<unsigned_char>_> fp1;
  vector<unsigned_char,_std::allocator<unsigned_char>_> pk_bytes2;
  vector<unsigned_char,_std::allocator<unsigned_char>_> pk_bytes1;
  vector<unsigned_char,_std::allocator<unsigned_char>_> txout_val_bytes;
  vector<unsigned_char,_std::allocator<unsigned_char>_> txout_key_bytes;
  Address addr2;
  Address addr1;
  KeyData key2;
  KeyData key1;
  string path2;
  string path1;
  HDWallet wallet2;
  HDWallet wallet1;
  Psbt psbt;
  string *in_stack_ffffffffffffeb48;
  KeyData *in_stack_ffffffffffffeb50;
  undefined7 in_stack_ffffffffffffeb58;
  undefined1 in_stack_ffffffffffffeb5f;
  allocator_type *in_stack_ffffffffffffeb60;
  undefined7 in_stack_ffffffffffffeb68;
  undefined1 in_stack_ffffffffffffeb6f;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_ffffffffffffeb70;
  undefined7 in_stack_ffffffffffffec08;
  Psbt *in_stack_ffffffffffffec10;
  AssertHelper local_1360;
  Message local_1358;
  string local_1350;
  AssertionResult local_1330;
  AssertHelper local_1320;
  Message local_1318;
  string local_1310;
  string local_12f0;
  AssertionResult local_12d0;
  AssertHelper local_12c0;
  Message local_12b8;
  string local_12b0;
  string local_1290;
  AssertionResult local_1270;
  AssertHelper local_1260;
  Message local_1258;
  size_type local_1250;
  undefined4 local_1244;
  AssertionResult local_1240;
  vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> local_1230;
  AssertHelper local_1218;
  Message local_1210;
  string local_1208;
  string local_11e8;
  AssertionResult local_11c8;
  AssertHelper local_11b8;
  Message local_11b0;
  string local_11a8;
  string local_1188;
  AssertionResult local_1168;
  ByteData local_1158;
  ByteData local_1140;
  ByteData local_1128 [6];
  string local_1090;
  AssertHelper local_1070;
  Message local_1068;
  undefined1 local_1059;
  AssertionResult local_1058;
  string local_1048;
  AssertHelper local_1028;
  Message local_1020;
  byte local_1011;
  AssertionResult local_1010;
  string local_1000;
  AssertHelper local_fe0;
  Message local_fd8;
  undefined1 local_fc9;
  AssertionResult local_fc8;
  allocator local_fb1;
  string local_fb0;
  ByteData local_f90;
  allocator local_f71;
  string local_f70;
  allocator local_f49;
  string local_f48;
  ByteData local_f28;
  allocator local_f09;
  string local_f08;
  ByteData local_ee8;
  allocator local_ec9;
  string local_ec8;
  allocator local_ea1;
  string local_ea0;
  ByteData local_e80;
  AssertHelper local_e68;
  Message local_e60;
  string local_e58;
  string local_e38;
  AssertionResult local_e18;
  AssertHelper local_e08;
  Message local_e00;
  string local_df8;
  string local_dd8;
  AssertionResult local_db8;
  KeyData local_da8;
  KeyData local_c20;
  ByteData local_a98;
  Psbt local_a80;
  AssertHelper local_a00;
  Message local_9f8;
  string local_9f0;
  AssertionResult local_9d0;
  AssertHelper local_9c0;
  Message local_9b8;
  ByteData local_9b0;
  string local_998;
  AssertionResult local_978;
  ByteData local_968;
  ByteData local_950;
  ByteData local_938;
  ByteData local_920;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_908;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_8f0;
  ByteData local_8d8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_8c0;
  ByteData local_8a8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_890;
  Pubkey local_878;
  ByteData local_860;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_848;
  Pubkey local_830;
  ByteData local_818;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_800;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_7e8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_7c8;
  Pubkey local_7b0;
  Address local_798;
  Pubkey local_618;
  Address local_600;
  KeyData local_480;
  KeyData local_2f8;
  allocator local_169;
  string local_168;
  allocator local_141;
  string local_140;
  ByteData local_120;
  HDWallet local_108;
  ByteData local_f0;
  HDWallet local_d8;
  allocator local_a9;
  string local_a8 [32];
  Psbt local_88;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_a8,
             "cHNidP8BAEgCAAAAAAIA4fUFAAAAABYAFLMivdzmM7hRrHNwq0VPCzZ6BlTlAOH1BQAAAAAWABTKuMU6bo/AKW0c05FaMH1RxJGlVQAAAAAAAAA="
             ,&local_a9);
  cfd::Psbt::Psbt((Psbt *)in_stack_ffffffffffffeb50,in_stack_ffffffffffffeb48);
  std::__cxx11::string::~string(local_a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_a9);
  cfd::core::ByteData::ByteData(&local_f0,&g_psbt_seed1_abi_cxx11_);
  cfd::core::HDWallet::HDWallet(&local_d8,&local_f0);
  cfd::core::ByteData::~ByteData((ByteData *)0x2b2e4d);
  cfd::core::ByteData::ByteData(&local_120,&g_psbt_seed2_abi_cxx11_);
  cfd::core::HDWallet::HDWallet(&local_108,&local_120);
  cfd::core::ByteData::~ByteData((ByteData *)0x2b2e87);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_140,"44h/0h/0h/0/2",&local_141);
  std::allocator<char>::~allocator((allocator<char> *)&local_141);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_168,"44h/0h/0h/0/2",&local_169);
  std::allocator<char>::~allocator((allocator<char> *)&local_169);
  cfd::core::HDWallet::GeneratePubkeyData(&local_2f8,&local_d8,kTestnet,&local_140,kNormal);
  cfd::core::HDWallet::GeneratePubkeyData(&local_480,&local_108,kTestnet,&local_168,kNormal);
  cfd::core::KeyData::GetPubkey(&local_618,&local_2f8);
  cfd::core::Address::Address(&local_600,kCfdIllegalArgumentError,kVersion0,&local_618);
  cfd::core::Pubkey::~Pubkey((Pubkey *)0x2b2f97);
  cfd::core::KeyData::GetPubkey(&local_7b0,&local_480);
  cfd::core::Address::Address(&local_798,kCfdIllegalArgumentError,kVersion0,&local_7b0);
  cfd::core::Pubkey::~Pubkey((Pubkey *)0x2b2fd9);
  std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)0x2b2fee);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (in_stack_ffffffffffffeb70,CONCAT17(in_stack_ffffffffffffeb6f,in_stack_ffffffffffffeb68)
             ,in_stack_ffffffffffffeb60);
  std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)0x2b3017);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x2b3024);
  pvVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_7c8,0);
  *pvVar6 = '\x02';
  cfd::core::KeyData::GetPubkey(&local_830,&local_2f8);
  cfd::core::Pubkey::GetData(&local_818,&local_830);
  cfd::core::ByteData::GetBytes(&local_800,&local_818);
  cfd::core::ByteData::~ByteData((ByteData *)0x2b308a);
  cfd::core::Pubkey::~Pubkey((Pubkey *)0x2b3097);
  cfd::core::KeyData::GetPubkey(&local_878,&local_480);
  cfd::core::Pubkey::GetData(&local_860,&local_878);
  cfd::core::ByteData::GetBytes(&local_848,&local_860);
  cfd::core::ByteData::~ByteData((ByteData *)0x2b30e9);
  cfd::core::Pubkey::~Pubkey((Pubkey *)0x2b30f6);
  cfd::core::KeyData::GetFingerprint(&local_8a8,&local_2f8);
  cfd::core::ByteData::GetBytes(&local_890,&local_8a8);
  cfd::core::ByteData::~ByteData((ByteData *)0x2b3131);
  cfd::core::KeyData::GetFingerprint(&local_8d8,&local_480);
  cfd::core::ByteData::GetBytes(&local_8c0,&local_8d8);
  cfd::core::ByteData::~ByteData((ByteData *)0x2b316c);
  cfd::core::KeyData::GetChildNumArray(&local_8f0,&local_2f8);
  cfd::core::KeyData::GetChildNumArray(&local_908,&local_480);
  pvVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_7c8,1);
  puVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x2b31c1);
  pvVar6[0x20] = puVar7[0x20];
  uVar1 = *(undefined8 *)puVar7;
  uVar2 = *(undefined8 *)(puVar7 + 8);
  uVar3 = *(undefined8 *)(puVar7 + 0x18);
  *(undefined8 *)(pvVar6 + 0x10) = *(undefined8 *)(puVar7 + 0x10);
  *(undefined8 *)(pvVar6 + 0x18) = uVar3;
  *(undefined8 *)pvVar6 = uVar1;
  *(undefined8 *)(pvVar6 + 8) = uVar2;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&local_8f0);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            (in_stack_ffffffffffffeb70,CONCAT17(in_stack_ffffffffffffeb6f,in_stack_ffffffffffffeb68)
            );
  puVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x2b3219);
  puVar8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x2b322e);
  *(undefined4 *)puVar7 = *(undefined4 *)puVar8;
  puVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x2b324a);
  puVar9 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::data
                     ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x2b326b);
  sVar10 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&local_8f0);
  memcpy(puVar7 + 4,puVar9,sVar10 << 2);
  cfd::core::ByteData::ByteData(&local_920,&local_7c8);
  cfd::core::ByteData::ByteData(&local_938,&local_7e8);
  pvVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_7c8,1);
  puVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x2b32f1);
  pvVar6[0x20] = puVar7[0x20];
  uVar1 = *(undefined8 *)puVar7;
  uVar2 = *(undefined8 *)(puVar7 + 8);
  uVar3 = *(undefined8 *)(puVar7 + 0x18);
  *(undefined8 *)(pvVar6 + 0x10) = *(undefined8 *)(puVar7 + 0x10);
  *(undefined8 *)(pvVar6 + 0x18) = uVar3;
  *(undefined8 *)pvVar6 = uVar1;
  *(undefined8 *)(pvVar6 + 8) = uVar2;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&local_908);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            (in_stack_ffffffffffffeb70,CONCAT17(in_stack_ffffffffffffeb6f,in_stack_ffffffffffffeb68)
            );
  puVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x2b3349);
  puVar8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x2b335e);
  *(undefined4 *)puVar7 = *(undefined4 *)puVar8;
  puVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x2b337a);
  puVar9 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::data
                     ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x2b339b);
  sVar10 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&local_908);
  memcpy(puVar7 + 4,puVar9,sVar10 << 2);
  cfd::core::ByteData::ByteData(&local_950,&local_7c8);
  cfd::core::ByteData::ByteData(&local_968,&local_7e8);
  cfd::core::Psbt::SetTxOutRecord(&local_88,0,&local_920,&local_938);
  cfd::core::Psbt::SetTxOutRecord(&local_88,1,&local_950,&local_968);
  cfd::core::Psbt::GetData(&local_9b0,&local_88);
  cfd::core::ByteData::GetHex_abi_cxx11_(&local_998,&local_9b0);
  pcVar11 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_978,
             "\"70736274ff01004802000000000200e1f50500000000160014b322bddce633b851ac7370ab454f0b367a0654e500e1f50500000000160014cab8c53a6e8fc0296d1cd3915a307d51c491a5550000000000220203473bfc8c770c1b220a2e7aae4badf6c0d7eaf29028d5b29d3438012bb289ef81182a7047602c00008000000080000000800000000002000000002202036474aff2633c351865539fb52b62b9d6fb9e4e23576628e1f0a0a7993458e06c189d6b6d862c0000800000008000000080000000000200000000\""
             ,"psbt.GetData().GetHex().c_str()",
             "70736274ff01004802000000000200e1f50500000000160014b322bddce633b851ac7370ab454f0b367a0654e500e1f50500000000160014cab8c53a6e8fc0296d1cd3915a307d51c491a5550000000000220203473bfc8c770c1b220a2e7aae4badf6c0d7eaf29028d5b29d3438012bb289ef81182a7047602c00008000000080000000800000000002000000002202036474aff2633c351865539fb52b62b9d6fb9e4e23576628e1f0a0a7993458e06c189d6b6d862c0000800000008000000080000000000200000000"
             ,pcVar11);
  std::__cxx11::string::~string((string *)&local_998);
  cfd::core::ByteData::~ByteData((ByteData *)0x2b34bb);
  bVar4 = testing::AssertionResult::operator_cast_to_bool(&local_978);
  if (!bVar4) {
    testing::Message::Message(&local_9b8);
    in_stack_ffffffffffffec10 =
         (Psbt *)testing::AssertionResult::failure_message((AssertionResult *)0x2b393e);
    testing::internal::AssertHelper::AssertHelper
              (&local_9c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_psbt.cpp"
               ,0x51f,(char *)in_stack_ffffffffffffec10);
    testing::internal::AssertHelper::operator=(&local_9c0,&local_9b8);
    testing::internal::AssertHelper::~AssertHelper(&local_9c0);
    testing::Message::~Message((Message *)0x2b39a1);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x2b39f9);
  cfd::core::Psbt::GetBase64_abi_cxx11_(&local_9f0,&local_88);
  pcVar11 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_9d0,
             "\"cHNidP8BAEgCAAAAAAIA4fUFAAAAABYAFLMivdzmM7hRrHNwq0VPCzZ6BlTlAOH1BQAAAAAWABTKuMU6bo/AKW0c05FaMH1RxJGlVQAAAAAAIgIDRzv8jHcMGyIKLnquS632wNfq8pAo1bKdNDgBK7KJ74EYKnBHYCwAAIAAAACAAAAAgAAAAAACAAAAACICA2R0r/JjPDUYZVOftStiudb7nk4jV2Yo4fCgp5k0WOBsGJ1rbYYsAACAAAAAgAAAAIAAAAAAAgAAAAA=\""
             ,"psbt.GetBase64().c_str()",
             "cHNidP8BAEgCAAAAAAIA4fUFAAAAABYAFLMivdzmM7hRrHNwq0VPCzZ6BlTlAOH1BQAAAAAWABTKuMU6bo/AKW0c05FaMH1RxJGlVQAAAAAAIgIDRzv8jHcMGyIKLnquS632wNfq8pAo1bKdNDgBK7KJ74EYKnBHYCwAAIAAAACAAAAAgAAAAAACAAAAACICA2R0r/JjPDUYZVOftStiudb7nk4jV2Yo4fCgp5k0WOBsGJ1rbYYsAACAAAAAgAAAAIAAAAAAAgAAAAA="
             ,pcVar11);
  std::__cxx11::string::~string((string *)&local_9f0);
  uVar5 = testing::AssertionResult::operator_cast_to_bool(&local_9d0);
  if (!(bool)uVar5) {
    testing::Message::Message(&local_9f8);
    pcVar11 = testing::AssertionResult::failure_message((AssertionResult *)0x2b3ae6);
    testing::internal::AssertHelper::AssertHelper
              (&local_a00,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_psbt.cpp"
               ,0x520,pcVar11);
    testing::internal::AssertHelper::operator=(&local_a00,&local_9f8);
    testing::internal::AssertHelper::~AssertHelper(&local_a00);
    testing::Message::~Message((Message *)0x2b3b49);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x2b3ba1);
  cfd::core::Psbt::GetData(&local_a98,&local_88);
  cfd::Psbt::Psbt((Psbt *)in_stack_ffffffffffffeb50,(ByteData *)in_stack_ffffffffffffeb48);
  cfd::core::ByteData::~ByteData((ByteData *)0x2b3bdc);
  cfd::core::Psbt::GetTxOutKeyData(&local_c20,&local_a80,0,false);
  cfd::core::Psbt::GetTxOutKeyData(&local_da8,&local_a80,1,false);
  cfd::core::KeyData::ToString_abi_cxx11_(&local_dd8,&local_c20,true,kApostrophe,false);
  cfd::core::KeyData::ToString_abi_cxx11_(&local_df8,&local_2f8,true,kApostrophe,false);
  testing::internal::EqHelper<false>::Compare<std::__cxx11::string,std::__cxx11::string>
            ((char *)CONCAT17(in_stack_ffffffffffffeb6f,in_stack_ffffffffffffeb68),
             (char *)in_stack_ffffffffffffeb60,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffeb5f,in_stack_ffffffffffffeb58),
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffeb50);
  std::__cxx11::string::~string((string *)&local_df8);
  std::__cxx11::string::~string((string *)&local_dd8);
  bVar4 = testing::AssertionResult::operator_cast_to_bool(&local_db8);
  if (!bVar4) {
    testing::Message::Message(&local_e00);
    pcVar11 = testing::AssertionResult::failure_message((AssertionResult *)0x2b3dcc);
    testing::internal::AssertHelper::AssertHelper
              (&local_e08,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_psbt.cpp"
               ,0x525,pcVar11);
    testing::internal::AssertHelper::operator=(&local_e08,&local_e00);
    testing::internal::AssertHelper::~AssertHelper(&local_e08);
    testing::Message::~Message((Message *)0x2b3e2f);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x2b3e87);
  cfd::core::KeyData::ToString_abi_cxx11_(&local_e38,&local_da8,true,kApostrophe,false);
  cfd::core::KeyData::ToString_abi_cxx11_(&local_e58,&local_480,true,kApostrophe,false);
  testing::internal::EqHelper<false>::Compare<std::__cxx11::string,std::__cxx11::string>
            ((char *)CONCAT17(in_stack_ffffffffffffeb6f,in_stack_ffffffffffffeb68),
             (char *)in_stack_ffffffffffffeb60,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffeb5f,in_stack_ffffffffffffeb58),
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffeb50);
  std::__cxx11::string::~string((string *)&local_e58);
  std::__cxx11::string::~string((string *)&local_e38);
  bVar4 = testing::AssertionResult::operator_cast_to_bool(&local_e18);
  if (!bVar4) {
    testing::Message::Message(&local_e60);
    pcVar11 = testing::AssertionResult::failure_message((AssertionResult *)0x2b3fca);
    testing::internal::AssertHelper::AssertHelper
              (&local_e68,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_psbt.cpp"
               ,0x526,pcVar11);
    testing::internal::AssertHelper::operator=(&local_e68,&local_e60);
    testing::internal::AssertHelper::~AssertHelper(&local_e68);
    testing::Message::~Message((Message *)0x2b402d);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x2b4085);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_ea0,"cfd",&local_ea1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_ec8,"dummy1",&local_ec9);
  cfd::core::Psbt::CreateRecordKey(&local_e80,0xfc,&local_ea0,'\0',&local_ec8);
  std::__cxx11::string::~string((string *)&local_ec8);
  std::allocator<char>::~allocator((allocator<char> *)&local_ec9);
  std::__cxx11::string::~string((string *)&local_ea0);
  std::allocator<char>::~allocator((allocator<char> *)&local_ea1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_f08,"01020304",&local_f09);
  cfd::core::ByteData::ByteData(&local_ee8,&local_f08);
  std::__cxx11::string::~string((string *)&local_f08);
  std::allocator<char>::~allocator((allocator<char> *)&local_f09);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_f48,"cfd",&local_f49);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_f70,"dummy2",&local_f71);
  cfd::core::Psbt::CreateRecordKey(&local_f28,0xfc,&local_f48,'\0',&local_f70);
  std::__cxx11::string::~string((string *)&local_f70);
  std::allocator<char>::~allocator((allocator<char> *)&local_f71);
  std::__cxx11::string::~string((string *)&local_f48);
  std::allocator<char>::~allocator((allocator<char> *)&local_f49);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_fb0,"00",&local_fb1);
  cfd::core::ByteData::ByteData(&local_f90,&local_fb0);
  std::__cxx11::string::~string((string *)&local_fb0);
  std::allocator<char>::~allocator((allocator<char> *)&local_fb1);
  cfd::core::Psbt::SetTxOutRecord(&local_88,0,&local_e80,&local_ee8);
  local_fc9 = cfd::core::Psbt::IsFindTxOutRecord(&local_88,0,&local_e80);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)in_stack_ffffffffffffeb50,(bool *)in_stack_ffffffffffffeb48,
             (type *)0x2b431f);
  bVar4 = testing::AssertionResult::operator_cast_to_bool(&local_fc8);
  if (!bVar4) {
    testing::Message::Message(&local_fd8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_1000,(internal *)&local_fc8,
               (AssertionResult *)"psbt.IsFindTxOutRecord(0, global_key1)","false","true",in_R9);
    pcVar11 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_fe0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_psbt.cpp"
               ,0x52d,pcVar11);
    testing::internal::AssertHelper::operator=(&local_fe0,&local_fd8);
    testing::internal::AssertHelper::~AssertHelper(&local_fe0);
    std::__cxx11::string::~string((string *)&local_1000);
    testing::Message::~Message((Message *)0x2b45b7);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x2b462f);
  bVar4 = cfd::core::Psbt::IsFindTxOutRecord(&local_88,0,&local_f28);
  local_1011 = ~bVar4 & 1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)in_stack_ffffffffffffeb50,(bool *)in_stack_ffffffffffffeb48,
             (type *)0x2b4674);
  bVar4 = testing::AssertionResult::operator_cast_to_bool(&local_1010);
  if (!bVar4) {
    testing::Message::Message(&local_1020);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_1048,(internal *)&local_1010,
               (AssertionResult *)"psbt.IsFindTxOutRecord(0, global_key2)","true","false",in_R9);
    pcVar11 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1028,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_psbt.cpp"
               ,0x52e,pcVar11);
    testing::internal::AssertHelper::operator=(&local_1028,&local_1020);
    testing::internal::AssertHelper::~AssertHelper(&local_1028);
    std::__cxx11::string::~string((string *)&local_1048);
    testing::Message::~Message((Message *)0x2b476c);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x2b47e7);
  cfd::core::Psbt::SetTxOutRecord(&local_88,0,&local_f28,&local_f90);
  local_1059 = cfd::core::Psbt::IsFindTxOutRecord(&local_88,0,&local_f28);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)in_stack_ffffffffffffeb50,(bool *)in_stack_ffffffffffffeb48,
             (type *)0x2b484b);
  bVar4 = testing::AssertionResult::operator_cast_to_bool(&local_1058);
  if (!bVar4) {
    testing::Message::Message(&local_1068);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_1090,(internal *)&local_1058,
               (AssertionResult *)"psbt.IsFindTxOutRecord(0, global_key2)","false","true",in_R9);
    pcVar11 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1070,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_psbt.cpp"
               ,0x530,pcVar11);
    testing::internal::AssertHelper::operator=(&local_1070,&local_1068);
    testing::internal::AssertHelper::~AssertHelper(&local_1070);
    std::__cxx11::string::~string((string *)&local_1090);
    testing::Message::~Message((Message *)0x2b4943);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x2b49be);
  cfd::core::Psbt::GetData(local_1128,&local_88);
  cfd::Psbt::Psbt((Psbt *)in_stack_ffffffffffffeb50,(ByteData *)in_stack_ffffffffffffeb48);
  cfd::Psbt::operator=(in_stack_ffffffffffffec10,(Psbt *)CONCAT17(uVar5,in_stack_ffffffffffffec08));
  cfd::Psbt::~Psbt((Psbt *)in_stack_ffffffffffffeb50);
  cfd::core::ByteData::~ByteData((ByteData *)0x2b4a1d);
  cfd::core::Psbt::GetTxOutRecord(&local_1140,&local_a80,0,&local_e80);
  cfd::core::Psbt::GetTxOutRecord(&local_1158,&local_a80,0,&local_f28);
  cfd::core::ByteData::GetHex_abi_cxx11_(&local_1188,&local_1140);
  cfd::core::ByteData::GetHex_abi_cxx11_(&local_11a8,&local_ee8);
  testing::internal::EqHelper<false>::Compare<std::__cxx11::string,std::__cxx11::string>
            ((char *)CONCAT17(in_stack_ffffffffffffeb6f,in_stack_ffffffffffffeb68),
             (char *)in_stack_ffffffffffffeb60,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffeb5f,in_stack_ffffffffffffeb58),
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffeb50);
  std::__cxx11::string::~string((string *)&local_11a8);
  std::__cxx11::string::~string((string *)&local_1188);
  bVar4 = testing::AssertionResult::operator_cast_to_bool(&local_1168);
  if (!bVar4) {
    testing::Message::Message(&local_11b0);
    pcVar11 = testing::AssertionResult::failure_message((AssertionResult *)0x2b4c04);
    testing::internal::AssertHelper::AssertHelper
              (&local_11b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_psbt.cpp"
               ,0x535,pcVar11);
    testing::internal::AssertHelper::operator=(&local_11b8,&local_11b0);
    testing::internal::AssertHelper::~AssertHelper(&local_11b8);
    testing::Message::~Message((Message *)0x2b4c61);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x2b4cb9);
  cfd::core::ByteData::GetHex_abi_cxx11_(&local_11e8,&local_1158);
  cfd::core::ByteData::GetHex_abi_cxx11_(&local_1208,&local_f90);
  testing::internal::EqHelper<false>::Compare<std::__cxx11::string,std::__cxx11::string>
            ((char *)CONCAT17(in_stack_ffffffffffffeb6f,in_stack_ffffffffffffeb68),
             (char *)in_stack_ffffffffffffeb60,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffeb5f,in_stack_ffffffffffffeb58),
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffeb50);
  std::__cxx11::string::~string((string *)&local_1208);
  std::__cxx11::string::~string((string *)&local_11e8);
  bVar4 = testing::AssertionResult::operator_cast_to_bool(&local_11c8);
  if (!bVar4) {
    testing::Message::Message(&local_1210);
    pcVar11 = testing::AssertionResult::failure_message((AssertionResult *)0x2b4de0);
    testing::internal::AssertHelper::AssertHelper
              (&local_1218,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_psbt.cpp"
               ,0x536,pcVar11);
    testing::internal::AssertHelper::operator=(&local_1218,&local_1210);
    testing::internal::AssertHelper::~AssertHelper(&local_1218);
    testing::Message::~Message((Message *)0x2b4e3d);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x2b4e95);
  cfd::core::Psbt::GetTxOutRecordKeyList(&local_1230,&local_a80,0);
  local_1244 = 2;
  local_1250 = std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::size
                         (&local_1230);
  testing::internal::EqHelper<false>::Compare<int,unsigned_long>
            ((char *)CONCAT17(in_stack_ffffffffffffeb6f,in_stack_ffffffffffffeb68),
             (char *)in_stack_ffffffffffffeb60,
             (int *)CONCAT17(in_stack_ffffffffffffeb5f,in_stack_ffffffffffffeb58),
             (unsigned_long *)in_stack_ffffffffffffeb50);
  bVar4 = testing::AssertionResult::operator_cast_to_bool(&local_1240);
  if (!bVar4) {
    testing::Message::Message(&local_1258);
    pcVar11 = testing::AssertionResult::failure_message((AssertionResult *)0x2b4f7d);
    testing::internal::AssertHelper::AssertHelper
              (&local_1260,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_psbt.cpp"
               ,0x539,pcVar11);
    testing::internal::AssertHelper::operator=(&local_1260,&local_1258);
    testing::internal::AssertHelper::~AssertHelper(&local_1260);
    testing::Message::~Message((Message *)0x2b4fda);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x2b5032);
  sVar10 = std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::size(&local_1230)
  ;
  if (sVar10 == 2) {
    cfd::core::ByteData::GetHex_abi_cxx11_(&local_1290,&local_e80);
    pvVar12 = std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::operator[]
                        (&local_1230,0);
    cfd::core::ByteData::GetHex_abi_cxx11_(&local_12b0,pvVar12);
    testing::internal::EqHelper<false>::Compare<std::__cxx11::string,std::__cxx11::string>
              ((char *)CONCAT17(in_stack_ffffffffffffeb6f,in_stack_ffffffffffffeb68),
               (char *)in_stack_ffffffffffffeb60,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_ffffffffffffeb5f,in_stack_ffffffffffffeb58),
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffeb50);
    std::__cxx11::string::~string((string *)&local_12b0);
    std::__cxx11::string::~string((string *)&local_1290);
    bVar4 = testing::AssertionResult::operator_cast_to_bool(&local_1270);
    if (!bVar4) {
      testing::Message::Message(&local_12b8);
      pcVar11 = testing::AssertionResult::failure_message((AssertionResult *)0x2b517c);
      testing::internal::AssertHelper::AssertHelper
                (&local_12c0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_psbt.cpp"
                 ,0x53b,pcVar11);
      testing::internal::AssertHelper::operator=(&local_12c0,&local_12b8);
      testing::internal::AssertHelper::~AssertHelper(&local_12c0);
      testing::Message::~Message((Message *)0x2b51d9);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x2b5231);
    cfd::core::ByteData::GetHex_abi_cxx11_(&local_12f0,&local_f28);
    pvVar12 = std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::operator[]
                        (&local_1230,1);
    cfd::core::ByteData::GetHex_abi_cxx11_(&local_1310,pvVar12);
    testing::internal::EqHelper<false>::Compare<std::__cxx11::string,std::__cxx11::string>
              ((char *)CONCAT17(in_stack_ffffffffffffeb6f,in_stack_ffffffffffffeb68),
               (char *)in_stack_ffffffffffffeb60,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_ffffffffffffeb5f,in_stack_ffffffffffffeb58),
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffeb50);
    std::__cxx11::string::~string((string *)&local_1310);
    std::__cxx11::string::~string((string *)&local_12f0);
    bVar4 = testing::AssertionResult::operator_cast_to_bool(&local_12d0);
    if (!bVar4) {
      testing::Message::Message(&local_1318);
      in_stack_ffffffffffffeb60 =
           (allocator_type *)testing::AssertionResult::failure_message((AssertionResult *)0x2b5365);
      testing::internal::AssertHelper::AssertHelper
                (&local_1320,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_psbt.cpp"
                 ,0x53c,(char *)in_stack_ffffffffffffeb60);
      testing::internal::AssertHelper::operator=(&local_1320,&local_1318);
      testing::internal::AssertHelper::~AssertHelper(&local_1320);
      testing::Message::~Message((Message *)0x2b53c2);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x2b5417);
  }
  cfd::core::Psbt::GetBase64_abi_cxx11_(&local_1350,&local_a80);
  pcVar11 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_1330,
             "\"cHNidP8BAEgCAAAAAAIA4fUFAAAAABYAFLMivdzmM7hRrHNwq0VPCzZ6BlTlAOH1BQAAAAAWABTKuMU6bo/AKW0c05FaMH1RxJGlVQAAAAAAIgIDRzv8jHcMGyIKLnquS632wNfq8pAo1bKdNDgBK7KJ74EYKnBHYCwAAIAAAACAAAAAgAAAAAACAAAADfwDY2ZkAAZkdW1teTEEAQIDBA38A2NmZAAGZHVtbXkyAQAAIgIDZHSv8mM8NRhlU5+1K2K51vueTiNXZijh8KCnmTRY4GwYnWtthiwAAIAAAACAAAAAgAAAAAACAAAAAA==\""
             ,"psbt2.GetBase64().c_str()",
             "cHNidP8BAEgCAAAAAAIA4fUFAAAAABYAFLMivdzmM7hRrHNwq0VPCzZ6BlTlAOH1BQAAAAAWABTKuMU6bo/AKW0c05FaMH1RxJGlVQAAAAAAIgIDRzv8jHcMGyIKLnquS632wNfq8pAo1bKdNDgBK7KJ74EYKnBHYCwAAIAAAACAAAAAgAAAAAACAAAADfwDY2ZkAAZkdW1teTEEAQIDBA38A2NmZAAGZHVtbXkyAQAAIgIDZHSv8mM8NRhlU5+1K2K51vueTiNXZijh8KCnmTRY4GwYnWtthiwAAIAAAACAAAAAgAAAAAACAAAAAA=="
             ,pcVar11);
  std::__cxx11::string::~string((string *)&local_1350);
  bVar4 = testing::AssertionResult::operator_cast_to_bool(&local_1330);
  if (!bVar4) {
    testing::Message::Message(&local_1358);
    in_stack_ffffffffffffeb50 =
         (KeyData *)testing::AssertionResult::failure_message((AssertionResult *)0x2b5500);
    testing::internal::AssertHelper::AssertHelper
              (&local_1360,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_psbt.cpp"
               ,0x53e,(char *)in_stack_ffffffffffffeb50);
    testing::internal::AssertHelper::operator=(&local_1360,&local_1358);
    testing::internal::AssertHelper::~AssertHelper(&local_1360);
    testing::Message::~Message((Message *)0x2b555d);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x2b55b5);
  std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector
            ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)
             in_stack_ffffffffffffeb60);
  cfd::core::ByteData::~ByteData((ByteData *)0x2b55cf);
  cfd::core::ByteData::~ByteData((ByteData *)0x2b55dc);
  cfd::core::ByteData::~ByteData((ByteData *)0x2b55e9);
  cfd::core::ByteData::~ByteData((ByteData *)0x2b55f6);
  cfd::core::ByteData::~ByteData((ByteData *)0x2b5603);
  cfd::core::ByteData::~ByteData((ByteData *)0x2b5610);
  cfd::core::KeyData::~KeyData(in_stack_ffffffffffffeb50);
  cfd::core::KeyData::~KeyData(in_stack_ffffffffffffeb50);
  cfd::Psbt::~Psbt((Psbt *)in_stack_ffffffffffffeb50);
  cfd::core::ByteData::~ByteData((ByteData *)0x2b5644);
  cfd::core::ByteData::~ByteData((ByteData *)0x2b5651);
  cfd::core::ByteData::~ByteData((ByteData *)0x2b565e);
  cfd::core::ByteData::~ByteData((ByteData *)0x2b566b);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_ffffffffffffeb60);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_ffffffffffffeb60);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffeb60);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffeb60);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffeb60);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffeb60);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffeb60);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffeb60);
  cfd::core::Address::~Address((Address *)in_stack_ffffffffffffeb50);
  cfd::core::Address::~Address((Address *)in_stack_ffffffffffffeb50);
  cfd::core::KeyData::~KeyData(in_stack_ffffffffffffeb50);
  cfd::core::KeyData::~KeyData(in_stack_ffffffffffffeb50);
  std::__cxx11::string::~string((string *)&local_168);
  std::__cxx11::string::~string((string *)&local_140);
  cfd::core::HDWallet::~HDWallet((HDWallet *)0x2b572e);
  cfd::core::HDWallet::~HDWallet((HDWallet *)0x2b573b);
  cfd::Psbt::~Psbt((Psbt *)in_stack_ffffffffffffeb50);
  return;
}

Assistant:

TEST(Psbt, SetOutputRecordTest) {
  Psbt psbt("cHNidP8BAEgCAAAAAAIA4fUFAAAAABYAFLMivdzmM7hRrHNwq0VPCzZ6BlTlAOH1BQAAAAAWABTKuMU6bo/AKW0c05FaMH1RxJGlVQAAAAAAAAA=");

  HDWallet wallet1 = HDWallet(ByteData(g_psbt_seed1));
  HDWallet wallet2 = HDWallet(ByteData(g_psbt_seed2));
  std::string path1 = "44h/0h/0h/0/2";
  std::string path2 = "44h/0h/0h/0/2";
  auto key1 = wallet1.GeneratePubkeyData(NetType::kTestnet, path1);
  auto key2 = wallet2.GeneratePubkeyData(NetType::kTestnet, path2);
  auto addr1 = Address(NetType::kTestnet, WitnessVersion::kVersion0, key1.GetPubkey());
  auto addr2 = Address(NetType::kTestnet, WitnessVersion::kVersion0, key2.GetPubkey());

  std::vector<uint8_t> txout_key_bytes(34);
  std::vector<uint8_t> txout_val_bytes;
  txout_key_bytes[0] = 2;
  auto pk_bytes1 = key1.GetPubkey().GetData().GetBytes();
  auto pk_bytes2 = key2.GetPubkey().GetData().GetBytes();
  auto fp1 = key1.GetFingerprint().GetBytes();
  auto fp2 = key2.GetFingerprint().GetBytes();
  auto plist1 = key1.GetChildNumArray();
  auto plist2 = key2.GetChildNumArray();
  memcpy(&txout_key_bytes[1], pk_bytes1.data(), 33);
  txout_val_bytes.resize(4 + (plist1.size() * 4));
  memcpy(txout_val_bytes.data(), fp1.data(), 4);
  memcpy(&txout_val_bytes.data()[4], plist1.data(), 4 * plist1.size());
  ByteData txout_key1 = ByteData(txout_key_bytes);
  ByteData txout_value1 = ByteData(txout_val_bytes);

  memcpy(&txout_key_bytes[1], pk_bytes2.data(), 33);
  txout_val_bytes.resize(4 + (plist2.size() * 4));
  memcpy(txout_val_bytes.data(), fp2.data(), 4);
  memcpy(&txout_val_bytes.data()[4], plist2.data(), 4 * plist2.size());
  ByteData txout_key2 = ByteData(txout_key_bytes);
  ByteData txout_value2 = ByteData(txout_val_bytes);

  psbt.SetTxOutRecord(0, txout_key1, txout_value1);
  // EXPECT_TRUE(psbt.IsFindTxOutRecord(0, txout_key1));
  // EXPECT_FALSE(psbt.IsFindTxOutRecord(1, txout_key2));
  psbt.SetTxOutRecord(1, txout_key2, txout_value2);
  // EXPECT_TRUE(psbt.IsFindTxOutRecord(1, txout_key2));

  EXPECT_STREQ("70736274ff01004802000000000200e1f50500000000160014b322bddce633b851ac7370ab454f0b367a0654e500e1f50500000000160014cab8c53a6e8fc0296d1cd3915a307d51c491a5550000000000220203473bfc8c770c1b220a2e7aae4badf6c0d7eaf29028d5b29d3438012bb289ef81182a7047602c00008000000080000000800000000002000000002202036474aff2633c351865539fb52b62b9d6fb9e4e23576628e1f0a0a7993458e06c189d6b6d862c0000800000008000000080000000000200000000", psbt.GetData().GetHex().c_str());
  EXPECT_STREQ("cHNidP8BAEgCAAAAAAIA4fUFAAAAABYAFLMivdzmM7hRrHNwq0VPCzZ6BlTlAOH1BQAAAAAWABTKuMU6bo/AKW0c05FaMH1RxJGlVQAAAAAAIgIDRzv8jHcMGyIKLnquS632wNfq8pAo1bKdNDgBK7KJ74EYKnBHYCwAAIAAAACAAAAAgAAAAAACAAAAACICA2R0r/JjPDUYZVOftStiudb7nk4jV2Yo4fCgp5k0WOBsGJ1rbYYsAACAAAAAgAAAAIAAAAAAAgAAAAA=", psbt.GetBase64().c_str());

  Psbt psbt2(psbt.GetData());
  auto get_val1 = psbt2.GetTxOutKeyData(0);
  auto get_val2 = psbt2.GetTxOutKeyData(1);
  EXPECT_EQ(get_val1.ToString(), key1.ToString());
  EXPECT_EQ(get_val2.ToString(), key2.ToString());

  ByteData global_key1 = Psbt::CreateRecordKey(kProprietary, "cfd", 0, "dummy1");
  ByteData global_value1 = ByteData("01020304");
  ByteData global_key2 = Psbt::CreateRecordKey(kProprietary, "cfd", 0, "dummy2");
  ByteData global_value2 = ByteData("00");
  psbt.SetTxOutRecord(0, global_key1, global_value1);
  EXPECT_TRUE(psbt.IsFindTxOutRecord(0, global_key1));
  EXPECT_FALSE(psbt.IsFindTxOutRecord(0, global_key2));
  psbt.SetTxOutRecord(0, global_key2, global_value2);
  EXPECT_TRUE(psbt.IsFindTxOutRecord(0, global_key2));

  psbt2 = Psbt(psbt.GetData());
  auto get_gval1 = psbt2.GetTxOutRecord(0, global_key1);
  auto get_gval2 = psbt2.GetTxOutRecord(0, global_key2);
  EXPECT_EQ(get_gval1.GetHex(), global_value1.GetHex());
  EXPECT_EQ(get_gval2.GetHex(), global_value2.GetHex());

  auto key_list = psbt2.GetTxOutRecordKeyList(0);
  EXPECT_EQ(2, key_list.size());
  if (key_list.size() == 2) {
    EXPECT_EQ(global_key1.GetHex(), key_list[0].GetHex());
    EXPECT_EQ(global_key2.GetHex(), key_list[1].GetHex());
  }
  EXPECT_STREQ("cHNidP8BAEgCAAAAAAIA4fUFAAAAABYAFLMivdzmM7hRrHNwq0VPCzZ6BlTlAOH1BQAAAAAWABTKuMU6bo/AKW0c05FaMH1RxJGlVQAAAAAAIgIDRzv8jHcMGyIKLnquS632wNfq8pAo1bKdNDgBK7KJ74EYKnBHYCwAAIAAAACAAAAAgAAAAAACAAAADfwDY2ZkAAZkdW1teTEEAQIDBA38A2NmZAAGZHVtbXkyAQAAIgIDZHSv8mM8NRhlU5+1K2K51vueTiNXZijh8KCnmTRY4GwYnWtthiwAAIAAAACAAAAAgAAAAAACAAAAAA==", psbt2.GetBase64().c_str());
}